

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_> *
__thiscall
CMU462::StaticScene::Mesh::get_primitives
          (vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
           *__return_storage_ptr__,Mesh *this)

{
  size_t v1;
  size_t v2;
  size_type sVar1;
  Triangle *this_00;
  const_reference pvVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  Triangle *local_50 [3];
  Triangle *local_38;
  Triangle *tri;
  size_t i;
  size_t num_triangles;
  Mesh *local_18;
  Mesh *this_local;
  vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
  *primitives;
  
  num_triangles._7_1_ = 0;
  local_18 = this;
  this_local = (Mesh *)__return_storage_ptr__;
  std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>::
  vector(__return_storage_ptr__);
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->indices);
  i = sVar1 / 3;
  for (tri = (Triangle *)0x0; tri < i;
      tri = (Triangle *)((long)&(tri->super_Primitive)._vptr_Primitive + 1)) {
    this_00 = (Triangle *)operator_new(0x40);
    this_01 = &this->indices;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this_01,(long)tri * 3);
    v1 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this_01,(long)tri * 3 + 1);
    v2 = *pvVar2;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (this_01,(long)tri * 3 + 2);
    Triangle::Triangle(this_00,this,v1,v2,*pvVar2);
    local_50[0] = this_00;
    local_38 = this_00;
    std::vector<CMU462::StaticScene::Primitive_*,_std::allocator<CMU462::StaticScene::Primitive_*>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<Primitive*> Mesh::get_primitives() const {

  vector<Primitive*> primitives;
  size_t num_triangles = indices.size() / 3;
  for (size_t i = 0; i < num_triangles; ++i) {
    Triangle* tri = new Triangle(this, indices[i * 3],
                                       indices[i * 3 + 1],
                                       indices[i * 3 + 2]);
    primitives.push_back(tri);
  }
  return primitives;
}